

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.h
# Opt level: O3

LogStream * __thiscall LogStream::operator<<(LogStream *this,char *str)

{
  char **ppcVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  
  ppcVar1 = &(this->buffer_).cur_;
  pcVar2 = (this->buffer_).cur_;
  iVar4 = (int)ppcVar1 - (int)pcVar2;
  if (str == (char *)0x0) {
    if (iVar4 < 10) {
      return this;
    }
    builtin_strncpy(pcVar2,"(nullptr)",9);
    lVar3 = 9;
  }
  else {
    if (iVar4 < 9) {
      return this;
    }
    *(undefined8 *)pcVar2 = *(undefined8 *)str;
    lVar3 = 8;
  }
  *ppcVar1 = *ppcVar1 + lVar3;
  return this;
}

Assistant:

LogStream& operator<<(const char* str){
        if(str){
            buffer_.append(str, sizeof(str));
        }else {
            buffer_.append("(nullptr)", 9);
        }
        return *this;
    }